

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

void __thiscall
TPZBlockDiagonal<double>::AutoFill
          (TPZBlockDiagonal<double> *this,int64_t neq,int64_t jeq,int symmetric)

{
  double dVar1;
  long lVar2;
  int iVar3;
  int64_t iVar4;
  long *plVar5;
  int *piVar6;
  long lVar7;
  double *pdVar8;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  _func_int **pp_Var9;
  double val;
  type_conflict1 sum;
  int64_t c;
  int64_t r;
  int64_t nb;
  int64_t pos;
  int64_t eq;
  int64_t bsize;
  int64_t b;
  int64_t blsize;
  int64_t totalsize;
  TPZStack<int,_10> blsizes;
  size_t in_stack_000002c8;
  char *in_stack_000002d0;
  int in_stack_fffffffffffffeac;
  TPZStack<int,_10> *in_stack_fffffffffffffeb0;
  TPZStack<int,_10> *in_stack_fffffffffffffec0;
  TPZMatrix<double> *in_stack_fffffffffffffed0;
  TPZVec<int> *in_stack_fffffffffffffef8;
  TPZBlockDiagonal<double> *in_stack_ffffffffffffff00;
  long local_e8;
  double local_c8;
  long local_c0;
  long local_b8;
  int64_t local_90;
  long local_70;
  
  if (in_RSI != in_RDX) {
    pzinternal::DebugStopImpl(in_stack_000002d0,in_stack_000002c8);
  }
  TPZStack<int,_10>::TPZStack(in_stack_fffffffffffffec0);
  for (local_70 = 0; local_70 < in_RSI; local_70 = local_e8 + local_70) {
    iVar3 = rand();
    local_e8 = (in_RSI * iVar3) / 0x7fffffff;
    if (in_RSI - local_70 <= local_e8) {
      local_e8 = in_RSI - local_70;
    }
    TPZStack<int,_10>::Push(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  }
  Initialize(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  iVar4 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x60));
  for (local_90 = 0; local_90 < iVar4; local_90 = local_90 + 1) {
    plVar5 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_90);
    lVar2 = *plVar5;
    piVar6 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x60),local_90);
    lVar7 = (long)*piVar6;
    for (local_c0 = 0; local_c0 < lVar7; local_c0 = local_c0 + 1) {
      local_c8 = 0.0;
      local_b8 = 0;
      if (in_ECX == 1) {
        for (local_b8 = 0; local_b8 < local_c0; local_b8 = local_b8 + 1) {
          pdVar8 = TPZVec<double>::operator[]
                             ((TPZVec<double> *)(in_RDI + 0x20),lVar2 + local_b8 + local_c0 * lVar7)
          ;
          dVar1 = *pdVar8;
          pdVar8 = TPZVec<double>::operator[]
                             ((TPZVec<double> *)(in_RDI + 0x20),lVar2 + local_c0 + local_b8 * lVar7)
          ;
          *pdVar8 = dVar1;
          pdVar8 = TPZVec<double>::operator[]
                             ((TPZVec<double> *)(in_RDI + 0x20),lVar2 + local_b8 + local_c0 * lVar7)
          ;
          local_c8 = ABS(*pdVar8) + local_c8;
        }
      }
      for (; local_b8 < lVar7; local_b8 = local_b8 + 1) {
        pp_Var9 = (_func_int **)TPZMatrix<double>::GetRandomVal(in_stack_fffffffffffffed0);
        in_stack_fffffffffffffed0 =
             (TPZMatrix<double> *)
             TPZVec<double>::operator[]
                       ((TPZVec<double> *)(in_RDI + 0x20),lVar2 + local_c0 + local_b8 * lVar7);
        (in_stack_fffffffffffffed0->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable = pp_Var9
        ;
        if (local_c0 != local_b8) {
          local_c8 = ABS((double)pp_Var9) + local_c8;
        }
      }
      pdVar8 = TPZVec<double>::operator[]
                         ((TPZVec<double> *)(in_RDI + 0x20),lVar2 + local_c0 + local_c0 * lVar7);
      if (ABS(*pdVar8) < local_c8) {
        local_c8 = local_c8 + 1.0;
        pdVar8 = TPZVec<double>::operator[]
                           ((TPZVec<double> *)(in_RDI + 0x20),lVar2 + local_c0 + local_c0 * lVar7);
        *pdVar8 = local_c8;
      }
    }
  }
  TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x11ed693);
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::AutoFill(int64_t neq, int64_t jeq, int symmetric) {
    if (neq != jeq) {
        DebugStop();
    }
    TPZStack<int> blsizes;
    int64_t totalsize = 0;
    while (totalsize < neq) {
        int64_t blsize = (neq*rand())/RAND_MAX;
        blsize = blsize < neq-totalsize ? blsize : neq-totalsize;
        blsizes.Push(blsize);
        totalsize += blsize;
    }
    Initialize(blsizes);
    // Initialize the blocksizes!!
	int64_t b, bsize, eq = 0, pos;
	int64_t nb = fBlockSize.NElements(), r, c;
	for ( b=0; b<nb; b++) {
		pos= fBlockPos[b];
		bsize = fBlockSize[b];
		for(c=0; c<bsize; c++) {
            RTVar sum = 0.;
            r=0;
            if (symmetric == 1) {
                for (r=0; r<c; r++) {
                    fStorage[pos+c+r*bsize]=fStorage[pos+r+c*bsize];
                    sum += fabs(fStorage[pos+r+c*bsize]);
                }
            }
			for(; r<bsize; r++) {
				auto val = this->GetRandomVal();
				fStorage[pos+c+r*bsize] = (val);
                if(c!= r) sum += fabs(val);
			}
            //totototo
//            if(r==4)
//            {
//                std::cout << "sum " << sum << std::endl;
//            }
            if (fabs(fStorage[pos+c+c*bsize]) < sum) {
                fStorage[pos+c+c*bsize] = (TVar)(sum + (RTVar)1.);
            }
		}
		eq += bsize;
	}
}